

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O0

int net_udp_recv(NETSOCKET sock,NETADDR *addr,void *data,int maxsize)

{
  ssize_t sVar1;
  void *in_RCX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  long in_FS_OFFSET;
  int bytes;
  socklen_t fromlen;
  char sockaddrbuf [128];
  NETADDR *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  int local_c8;
  int local_ac;
  socklen_t local_a8 [6];
  int iStack_90;
  int local_8c;
  sockaddr local_88 [8];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_c8 = 0;
  iStack_90 = (int)((ulong)in_RDI >> 0x20);
  local_8c = in_ESI;
  if (-1 < in_RDI) {
    local_a8[0] = 0x10;
    sVar1 = recvfrom(iStack_90,in_RCX,(long)in_R8D,0,local_88,local_a8);
    local_c8 = (int)sVar1;
  }
  if ((local_c8 < 1) && (-1 < local_8c)) {
    local_a8[0] = 0x1c;
    sVar1 = recvfrom(local_8c,in_RCX,(long)in_R8D,0,local_88,local_a8);
    local_c8 = (int)sVar1;
  }
  if (local_c8 < 1) {
    if (local_c8 == 0) {
      local_ac = 0;
    }
    else {
      local_ac = -1;
    }
  }
  else {
    sockaddr_to_netaddr((sockaddr *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                        in_stack_ffffffffffffff28);
    network_stats.recv_bytes = local_c8 + network_stats.recv_bytes;
    network_stats.recv_packets = network_stats.recv_packets + 1;
    local_ac = local_c8;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_ac;
  }
  __stack_chk_fail();
}

Assistant:

int net_udp_recv(NETSOCKET sock, NETADDR *addr, void *data, int maxsize)
{
	char sockaddrbuf[128];
	socklen_t fromlen;// = sizeof(sockaddrbuf);
	int bytes = 0;

	if(sock.ipv4sock >= 0)
	{
		fromlen = sizeof(struct sockaddr_in);
		bytes = recvfrom(sock.ipv4sock, (char*)data, maxsize, 0, (struct sockaddr *)&sockaddrbuf, &fromlen);
	}

	if(bytes <= 0 && sock.ipv6sock >= 0)
	{
		fromlen = sizeof(struct sockaddr_in6);
		bytes = recvfrom(sock.ipv6sock, (char*)data, maxsize, 0, (struct sockaddr *)&sockaddrbuf, &fromlen);
	}

	if(bytes > 0)
	{
		sockaddr_to_netaddr((struct sockaddr *)&sockaddrbuf, addr);
		network_stats.recv_bytes += bytes;
		network_stats.recv_packets++;
		return bytes;
	}
	else if(bytes == 0)
		return 0;
	return -1; /* error */
}